

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv_uptime(double *uptime)

{
  int iVar1;
  int *piVar2;
  int local_ac;
  undefined1 auStack_a8 [4];
  int r;
  timespec now;
  char buf [128];
  double *uptime_local;
  
  iVar1 = uv__slurp("/proc/uptime",(char *)&now.tv_nsec,0x80);
  if ((iVar1 == 0) && (iVar1 = __isoc99_sscanf(&now.tv_nsec,"%lf",uptime), iVar1 == 1)) {
    return 0;
  }
  if (uv_uptime::no_clock_boottime == 0) {
    local_ac = clock_gettime(7,(timespec *)auStack_a8);
    if ((local_ac == 0) || (piVar2 = __errno_location(), *piVar2 != 0x16)) goto LAB_00d836bb;
    uv_uptime::no_clock_boottime = 1;
  }
  local_ac = clock_gettime(1,(timespec *)auStack_a8);
LAB_00d836bb:
  if (local_ac == 0) {
    *uptime = (double)_auStack_a8;
    uptime_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    uptime_local._4_4_ = -*piVar2;
  }
  return uptime_local._4_4_;
}

Assistant:

int uv_uptime(double* uptime) {
  static volatile int no_clock_boottime;
  char buf[128];
  struct timespec now;
  int r;

  /* Try /proc/uptime first, then fallback to clock_gettime(). */

  if (0 == uv__slurp("/proc/uptime", buf, sizeof(buf)))
    if (1 == sscanf(buf, "%lf", uptime))
      return 0;

  /* Try CLOCK_BOOTTIME first, fall back to CLOCK_MONOTONIC if not available
   * (pre-2.6.39 kernels). CLOCK_MONOTONIC doesn't increase when the system
   * is suspended.
   */
  if (no_clock_boottime) {
    retry_clock_gettime: r = clock_gettime(CLOCK_MONOTONIC, &now);
  }
  else if ((r = clock_gettime(CLOCK_BOOTTIME, &now)) && errno == EINVAL) {
    no_clock_boottime = 1;
    goto retry_clock_gettime;
  }

  if (r)
    return UV__ERR(errno);

  *uptime = now.tv_sec;
  return 0;
}